

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error raccess_guess_darwin_hfsplus
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  undefined8 in_RAX;
  size_t __n;
  char *__dest;
  FT_Error error;
  
  error = (FT_Error)((ulong)in_RAX >> 0x20);
  __n = strlen(base_file_name);
  if ((long)__n < 0x7ffffffa) {
    __dest = (char *)ft_mem_qalloc(library->memory,__n + 6,&error);
    if (error == 0) {
      memcpy(__dest,base_file_name,__n);
      builtin_strncpy(__dest + __n,"/rsrc",6);
      *result_file_name = __dest;
      *result_offset = 0;
      error = 0;
    }
  }
  else {
    error = 10;
  }
  return error;
}

Assistant:

static FT_Error
  raccess_guess_darwin_hfsplus( FT_Library  library,
                                FT_Stream   stream,
                                char       *base_file_name,
                                char      **result_file_name,
                                FT_Long    *result_offset )
  {
    /*
      Only meaningful on systems with hfs+ drivers (or Macs).
     */
    FT_Error   error;
    char*      newpath = NULL;
    FT_Memory  memory;
    FT_Long    base_file_len = (FT_Long)ft_strlen( base_file_name );

    FT_UNUSED( stream );


    memory = library->memory;

    if ( base_file_len + 6 > FT_INT_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_QALLOC( newpath, base_file_len + 6 ) )
      return error;

    FT_MEM_COPY( newpath, base_file_name, base_file_len );
    FT_MEM_COPY( newpath + base_file_len, "/rsrc", 6 );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }